

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O0

QDataStream * QtPrivate::readArrayBasedContainer<QList<QVariant>>(QDataStream *s,QList<QVariant> *c)

{
  Status SVar1;
  qint64 qVar2;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype n;
  qint64 size;
  StreamStateSaver stateSaver;
  value_type t;
  QDataStream *in_stack_ffffffffffffff88;
  StreamStateSaver *in_stack_ffffffffffffff90;
  QDataStream *local_40;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  StreamStateSaver::StreamStateSaver(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  QList<QVariant>::clear((QList<QVariant> *)in_stack_ffffffffffffff90);
  qVar2 = QDataStream::readQSizeType((QDataStream *)in_stack_ffffffffffffff90);
  if (qVar2 < 0) {
    QDataStream::setStatus((Status)in_RDI);
    local_40 = in_RDI;
  }
  else {
    QList<QVariant>::reserve((QList<QVariant> *)in_RDI,asize);
    for (in_stack_ffffffffffffff90 = (StreamStateSaver *)0x0; local_40 = in_RDI,
        (long)in_stack_ffffffffffffff90 < qVar2;
        in_stack_ffffffffffffff90 =
             (StreamStateSaver *)((long)&((DataPointer *)&in_stack_ffffffffffffff90->stream)->d + 1)
        ) {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant((QVariant *)0x92ece6);
      ::operator>>(in_RDI,(QVariant *)local_28.data);
      SVar1 = QDataStream::status(in_RDI);
      if (SVar1 == Ok) {
        QList<QVariant>::append
                  ((QList<QVariant> *)in_stack_ffffffffffffff90,
                   (parameter_type)in_stack_ffffffffffffff88);
      }
      else {
        QList<QVariant>::clear((QList<QVariant> *)in_stack_ffffffffffffff90);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
      local_40 = in_RDI;
      if (SVar1 != Ok) break;
    }
  }
  StreamStateSaver::~StreamStateSaver(in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == asize) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}